

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtkNew;
  char *pcVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Des_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  int Counter;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                  ,0xc0,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *)");
  }
  pNtkNew = Abc_NtkAlloc(ABC_NTK_NETLIST,pNtk->ntkFunc,1);
  pcVar1 = Abc_UtilStrsav(pNtk->pName);
  pNtkNew->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(pNtk->pSpec);
  pNtkNew->pSpec = pcVar1;
  Abc_NtkCleanCopy(pNtk);
  for (iVar7 = 0; iVar7 < pNtk->vPis->nSize; iVar7 = iVar7 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,iVar7);
    Abc_NtkDupObj(pNtkNew,pAVar2,0);
    pAVar6 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanouts).pArray];
    pcVar1 = Abc_ObjName(pAVar6);
    pAVar3 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar1);
    (pAVar6->field_6).pCopy = pAVar3;
    Abc_ObjAddFanin(pAVar3,(pAVar2->field_6).pCopy);
  }
  for (iVar7 = 0; iVar7 < pNtk->vPos->nSize; iVar7 = iVar7 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,iVar7);
    Abc_NtkDupObj(pNtkNew,pAVar2,0);
    pAVar6 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray];
    pcVar1 = Abc_ObjName(pAVar6);
    pAVar3 = Abc_NtkFindOrCreateNet(pNtkNew,pcVar1);
    (pAVar6->field_6).pCopy = pAVar3;
    Abc_ObjAddFanin((pAVar2->field_6).pCopy,pAVar3);
  }
  Counter = -1;
  Abc_NtkFlattenLogicHierarchy2_rec(pNtkNew,pNtk,&Counter);
  printf("Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n",
         (ulong)(uint)Counter,(ulong)(uint)pNtkNew->nObjCounts[10]);
  if (pNtk->pDesign != (Abc_Des_t *)0x0) {
    iVar7 = 0;
    pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pNtk->pDesign->vTops,0);
    if (pAVar4 != pNtk) {
      __assert_fail("Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                    ,0xe3,"Abc_Ntk_t *Abc_NtkFlattenLogicHierarchy2(Abc_Ntk_t *)");
    }
    pAVar5 = Abc_DesDupBlackboxes(pNtk->pDesign,pNtkNew);
    pNtkNew->pDesign = pAVar5;
    for (; iVar7 < pNtkNew->vBoxes->nSize; iVar7 = iVar7 + 1) {
      pAVar6 = Abc_NtkBox(pNtkNew,iVar7);
      if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 10) {
        pAVar6->field_5 =
             *(anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)(pAVar6->field_5).pData + 0x160);
      }
    }
  }
  Abc_NtkOrderCisCos(pNtkNew);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    puts("EXDC is not transformed.");
  }
  iVar7 = Abc_NtkCheck(pNtkNew);
  if (iVar7 == 0) {
    fwrite("Abc_NtkFlattenLogicHierarchy2(): Network check has failed.\n",0x3b,1,_stdout);
    Abc_NtkDelete(pNtkNew);
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkFlattenLogicHierarchy2( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pTerm, * pNet;
    int i, Counter;
    extern Abc_Des_t * Abc_DesDupBlackboxes( Abc_Des_t * p, Abc_Ntk_t * pNtkSave );

    assert( Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // duplicate PIs/POs and their nets
    Abc_NtkForEachPi( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanout0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pNet->pCopy, pTerm->pCopy );
    }
    Abc_NtkForEachPo( pNtk, pTerm, i )
    {
        Abc_NtkDupObj( pNtkNew, pTerm, 0 );
        pNet = Abc_ObjFanin0( pTerm );
        pNet->pCopy = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pNet) );
        Abc_ObjAddFanin( pTerm->pCopy, pNet->pCopy );
    }

    // recursively flatten hierarchy, create internal logic, add new PI/PO names if there are black boxes
    Counter = -1;
    Abc_NtkFlattenLogicHierarchy2_rec( pNtkNew, pNtk, &Counter );
    printf( "Hierarchy reader flattened %d instances of logic boxes and left %d black boxes.\n", 
        Counter, Abc_NtkBlackboxNum(pNtkNew) );

    if ( pNtk->pDesign )
    {
        // pass on the design
        assert( Vec_PtrEntry(pNtk->pDesign->vTops, 0) == pNtk );
        pNtkNew->pDesign = Abc_DesDupBlackboxes( pNtk->pDesign, pNtkNew );
        // update the pointers
        Abc_NtkForEachBlackbox( pNtkNew, pTerm, i )
            pTerm->pData = ((Abc_Ntk_t *)pTerm->pData)->pCopy;
    }

    // we may have added property outputs
    Abc_NtkOrderCisCos( pNtkNew );

    // copy the timing information
//    Abc_ManTimeDup( pNtk, pNtkNew );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        printf( "EXDC is not transformed.\n" );
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkFlattenLogicHierarchy2(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}